

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnscapPlugIn.cpp
# Opt level: O0

void libithicap_usage(void)

{
  fprintf(_stderr,"ITHICAP -- a DNSCAP plugin for ITHI data extraction.\n");
  fprintf(_stderr,"Usage: ithitools <options>\n");
  fprintf(_stderr,"Options:\n");
  fprintf(_stderr,"  -? -h              Print this page.\n");
  fprintf(_stderr,"  -v                 Print the current version number.\n");
  fprintf(_stderr,"  -o file.csv        output file containing the computed summary.\n");
  fprintf(_stderr,"  -r root-addr.txt   text file containing the list of root server addresses.\n");
  fprintf(_stderr,"  -a res-addr.txt\t  allowed list of resolver addresses. Traffic to or from\n");
  fprintf(_stderr,"                     addresses in this list will not be filtered out by the\n");
  fprintf(_stderr,"                     excessive traffic filtering mechanism.\n");
  fprintf(_stderr,"  -x res-addr.txt\t  excluded list of resolver addresses. Traffic to or from\n");
  fprintf(_stderr,"                     these addresses will be ignored when extracting traffic.\n")
  ;
  fprintf(_stderr,"  -e                 compute ratio of non-cached NX-Domain queries.\n");
  fprintf(_stderr,"  -f\t              Filter out address sources that generate too much traffic.\n"
         );
  fprintf(_stderr,"  -n number\t      Number of strings in the list of leaking domains(M332).\n");
  fprintf(_stderr,"  -T                 Capture a list of TLD found in user queries.\n");
  fprintf(_stderr,
          "  -t tld-file.txt    Text file containing a list of registered TLD, one per line.\n");
  fprintf(_stderr,"  -u tld-file.txt\t  Text file containing special usage TLD (RFC6761).\n");
  return;
}

Assistant:

void libithicap_usage()
    {
        fprintf(stderr, "ITHICAP -- a DNSCAP plugin for ITHI data extraction.\n");
        fprintf(stderr, "Usage: ithitools <options>\n");
        fprintf(stderr, "Options:\n");
        fprintf(stderr, "  -? -h              Print this page.\n");
        fprintf(stderr, "  -v                 Print the current version number.\n");
        fprintf(stderr, "  -o file.csv        output file containing the computed summary.\n");
        fprintf(stderr, "  -r root-addr.txt   text file containing the list of root server addresses.\n");
        fprintf(stderr, "  -a res-addr.txt	  allowed list of resolver addresses. Traffic to or from\n");
        fprintf(stderr, "                     addresses in this list will not be filtered out by the\n");
        fprintf(stderr, "                     excessive traffic filtering mechanism.\n");
        fprintf(stderr, "  -x res-addr.txt	  excluded list of resolver addresses. Traffic to or from\n");
        fprintf(stderr, "                     these addresses will be ignored when extracting traffic.\n");
        fprintf(stderr, "  -e                 compute ratio of non-cached NX-Domain queries.\n");
        fprintf(stderr, "  -f	              Filter out address sources that generate too much traffic.\n");
        fprintf(stderr, "  -n number	      Number of strings in the list of leaking domains(M332).\n");
        fprintf(stderr, "  -T                 Capture a list of TLD found in user queries.\n");
        fprintf(stderr, "  -t tld-file.txt    Text file containing a list of registered TLD, one per line.\n");
        fprintf(stderr, "  -u tld-file.txt	  Text file containing special usage TLD (RFC6761).\n");
#ifdef PRIVACY_CONSCIOUS
        fprintf(stderr, "  -A addr_list.txt   List all IP addresses and their usage in specified file.\n");
        fprintf(stderr, "  -E name_list.txt   List all DNS names found and their usage in specified file.\n");
        fprintf(stderr, "                     Options A and E are rather slow, and have privacy issues.\n");
        fprintf(stderr, "                     No such traces enabled by default.\n");
        fprintf(stderr, "  -g                 Compress addresses and names files using gzip (default: don't).\n");
#endif
    }